

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByName(FileDescriptor *this,string *key)

{
  anon_union_8_8_13f84498_for_Symbol_2 aVar1;
  Symbol SVar2;
  
  SVar2 = FileDescriptorTables::FindNestedSymbolOfType
                    (*(FileDescriptorTables **)(this + 0x90),this,key,FIELD);
  if (SVar2.type == NULL_SYMBOL) {
    aVar1.descriptor = (Descriptor *)0x0;
  }
  else {
    aVar1.descriptor = (Descriptor *)0x0;
    if (*(FieldDescriptor *)(SVar2.field_1.descriptor + 0x42) != (FieldDescriptor)0x0) {
      aVar1 = SVar2.field_1;
    }
  }
  return (FieldDescriptor *)aVar1.descriptor;
}

Assistant:

const FieldDescriptor* FileDescriptor::FindExtensionByName(
    const std::string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::FIELD);
  if (!result.IsNull() && result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return nullptr;
  }
}